

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

int re_matchp(re_t pattern,char *text)

{
  char *text_00;
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = -1;
  if (pattern != (re_t)0x0) {
    if (pattern->type == '\x02') {
      iVar1 = matchpattern(pattern + 1,text);
      iVar1 = iVar1 + -1;
    }
    else {
      lVar3 = 0;
      do {
        text_00 = text + lVar3;
        iVar2 = matchpattern(pattern,text_00);
        if (iVar2 != 0) {
          return -(uint)(text[lVar3] == '\0') | (uint)lVar3;
        }
        lVar3 = lVar3 + 1;
      } while (*text_00 != '\0');
    }
  }
  return iVar1;
}

Assistant:

int re_matchp(re_t pattern, const char* text)
{
  if (pattern != 0)
  {
    if (pattern[0].type == BEGIN)
    {
      return ((matchpattern(&pattern[1], text)) ? 0 : -1);
    }
    else
    {
      int idx = -1;

      do
      {
        idx += 1;
        
        if (matchpattern(pattern, text))
        {
          if (text[0] == '\0')
            return -1;
        
          return idx;
        }
      }
      while (*text++ != '\0');
    }
  }
  return -1;
}